

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t Write<unsigned_int>(uint *w)

{
  uint local_14;
  uint *puStack_10;
  uint32_t t;
  uint *w_local;
  
  local_14 = *w;
  puStack_10 = w;
  if (local_14 < *w) {
    printf("loss of data due to 64 -> 32 bit integer conversion");
  }
  fwrite(&local_14,4,1,(FILE *)out);
  return 4;
}

Assistant:

inline uint32_t Write<unsigned int>(const unsigned int& w)
{
	const uint32_t t = (uint32_t)w;
	if (w > t) {
		// this shouldn't happen, integers in Assimp data structures never exceed 2^32
		printf("loss of data due to 64 -> 32 bit integer conversion");
	}
	
	fwrite(&t,4,1,out);
	return 4;
}